

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::draw_vertex(Mesh *this,Vertex *v)

{
  Scene *pSVar1;
  long lVar2;
  
  pSVar1 = (this->super_SceneObject).scene;
  if (pSVar1 != (Scene *)0x0) {
    if ((Vertex *)(pSVar1->selected).element == v) {
      lVar2 = 0x1e0;
      goto LAB_0016dd93;
    }
    if ((Vertex *)(pSVar1->hovered).element == v) {
      lVar2 = 0x1d8;
      goto LAB_0016dd93;
    }
  }
  lVar2 = 0x1d0;
LAB_0016dd93:
  lVar2 = *(long *)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar2);
  glColor4fv(lVar2 + 0x10);
  glPointSize(*(undefined4 *)(lVar2 + 0x54));
  glBegin(0);
  glVertex3d((v->position).x,(v->position).y,(v->position).z);
  glEnd();
  glLineWidth(0x3f800000);
  glPointSize(0x3f800000);
  return;
}

Assistant:

void Mesh::draw_vertex(const Vertex *v) const {
  get_draw_style(v)->style_vertex();
  glBegin(GL_POINTS);
  glVertex3d(v->position.x, v->position.y, v->position.z);
  glEnd();
  get_draw_style(v)->style_reset();
}